

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Instruction::Instruction
          (Instruction *this,IRContext *c,spv_parsed_instruction_t *inst,DebugScope *dbg_scope)

{
  uint32_t uVar1;
  uint *local_48;
  uint *local_40;
  ushort *local_38;
  spv_parsed_operand_t *current_payload;
  DebugScope *pDStack_28;
  uint32_t i;
  DebugScope *dbg_scope_local;
  spv_parsed_instruction_t *inst_local;
  IRContext *c_local;
  Instruction *this_local;
  
  pDStack_28 = dbg_scope;
  dbg_scope_local = (DebugScope *)inst;
  inst_local = (spv_parsed_instruction_t *)c;
  c_local = (IRContext *)this;
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::IntrusiveNodeBase
            (&this->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_013b5d18;
  this->context_ = (IRContext *)inst_local;
  this->opcode_ = (uint)*(ushort *)((long)&dbg_scope_local[1].lexical_scope_ + 2);
  this->has_type_id_ = dbg_scope_local[2].lexical_scope_ != 0;
  this->has_result_id_ = dbg_scope_local[2].inlined_at_ != 0;
  uVar1 = IRContext::TakeNextUniqueId((IRContext *)inst_local);
  this->unique_id_ = uVar1;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&this->operands_);
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
            (&this->dbg_line_insts_);
  this->dbg_scope_ = *pDStack_28;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::reserve
            (&this->operands_,(ulong)(ushort)dbg_scope_local[4].lexical_scope_);
  for (current_payload._4_4_ = 0; current_payload._4_4_ < (ushort)dbg_scope_local[4].lexical_scope_;
      current_payload._4_4_ = current_payload._4_4_ + 1) {
    local_38 = (ushort *)((long)dbg_scope_local[3] + (ulong)current_payload._4_4_ * 0x10);
    local_40 = (uint *)((long)*dbg_scope_local + (long)(int)(uint)*local_38 * 4);
    local_48 = (uint *)((long)*dbg_scope_local + (long)(int)(uint)*local_38 * 4 +
                       (long)(int)(uint)local_38[1] * 4);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spv_operand_type_t_const&,unsigned_int_const*,unsigned_int_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
               &this->operands_,(spv_operand_type_t *)(local_38 + 2),&local_40,&local_48);
  }
  return;
}

Assistant:

Instruction::Instruction(IRContext* c, const spv_parsed_instruction_t& inst,
                         const DebugScope& dbg_scope)
    : utils::IntrusiveNodeBase<Instruction>(),
      context_(c),
      opcode_(static_cast<spv::Op>(inst.opcode)),
      has_type_id_(inst.type_id != 0),
      has_result_id_(inst.result_id != 0),
      unique_id_(c->TakeNextUniqueId()),
      dbg_scope_(dbg_scope) {
  operands_.reserve(inst.num_operands);
  for (uint32_t i = 0; i < inst.num_operands; ++i) {
    const auto& current_payload = inst.operands[i];
    operands_.emplace_back(
        current_payload.type, inst.words + current_payload.offset,
        inst.words + current_payload.offset + current_payload.num_words);
  }
}